

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O1

void __thiscall kj::Thread::ThreadState::ThreadState(ThreadState *this,Function<void_()> *func)

{
  ExceptionCallback *pEVar1;
  
  (this->func).impl.disposer = (func->impl).disposer;
  (this->func).impl.ptr = (func->impl).ptr;
  (func->impl).ptr = (Iface *)0x0;
  pEVar1 = getExceptionCallback();
  (*pEVar1->_vptr_ExceptionCallback[6])(&this->initializer,pEVar1);
  (this->exception).ptr.isSet = false;
  this->refcount = 2;
  return;
}

Assistant:

Thread::ThreadState::ThreadState(Function<void()> func)
    : func(kj::mv(func)),
      initializer(getExceptionCallback().getThreadInitializer()),
      exception(kj::none),
      refcount(2) {}